

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3SafetyCheckOk(sqlite3 *db)

{
  u8 uVar1;
  char *pcVar2;
  
  if (db == (sqlite3 *)0x0) {
    pcVar2 = "NULL";
  }
  else {
    uVar1 = db->eOpenState;
    if (uVar1 != 0xba) {
      if (uVar1 == 'v') {
        return 1;
      }
      if (uVar1 != 'm') {
        pcVar2 = "invalid";
        goto LAB_0011f0e1;
      }
    }
    pcVar2 = "unopened";
  }
LAB_0011f0e1:
  sqlite3_log(0x15,"API call with %s database connection pointer",pcVar2);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckOk(sqlite3 *db){
  u8 eOpenState;
  if( db==0 ){
    logBadConnection("NULL");
    return 0;
  }
  eOpenState = db->eOpenState;
  if( eOpenState!=SQLITE_STATE_OPEN ){
    if( sqlite3SafetyCheckSickOrOk(db) ){
      testcase( sqlite3GlobalConfig.xLog!=0 );
      logBadConnection("unopened");
    }
    return 0;
  }else{
    return 1;
  }
}